

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

void __thiscall
QLayoutPrivate::getMargin(QLayoutPrivate *this,int *result,int userMargin,PixelMetric pm)

{
  int iVar1;
  QLayout *this_00;
  QWidget *pQVar2;
  QStyle *pQVar3;
  undefined4 in_ECX;
  int in_EDX;
  int *in_RSI;
  QLayoutPrivate *in_RDI;
  QWidget *pw;
  QLayout *q;
  QWidget *in_stack_ffffffffffffffc8;
  
  if (in_RSI != (int *)0x0) {
    this_00 = q_func(in_RDI);
    if (in_EDX < 0) {
      if ((in_RDI->field_0x8c & 1) == 0) {
        *in_RSI = 0;
      }
      else {
        pQVar2 = QLayout::parentWidget(this_00);
        if (pQVar2 == (QWidget *)0x0) {
          *in_RSI = 0;
        }
        else {
          pQVar3 = QWidget::style(in_stack_ffffffffffffffc8);
          iVar1 = (**(code **)(*(long *)pQVar3 + 0xe0))(pQVar3,in_ECX,0,pQVar2);
          *in_RSI = iVar1;
        }
      }
    }
    else {
      *in_RSI = in_EDX;
    }
  }
  return;
}

Assistant:

void QLayoutPrivate::getMargin(int *result, int userMargin, QStyle::PixelMetric pm) const
{
    if (!result)
        return;

    Q_Q(const QLayout);
    if (userMargin >= 0) {
        *result = userMargin;
    } else if (!topLevel) {
        *result = 0;
    } else if (QWidget *pw = q->parentWidget()) {
        *result = pw->style()->pixelMetric(pm, nullptr, pw);
    } else {
        *result = 0;
    }
}